

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

char * Abc_SopFromTruthBin(char *pTruth)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t sVar10;
  Vec_Int_t *p;
  int *piVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar61;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar62;
  int iVar66;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  long lVar28;
  
  sVar10 = strlen(pTruth);
  uVar13 = (uint)sVar10;
  uVar15 = uVar13 - 1;
  uVar1 = 0x1f;
  if (uVar15 != 0) {
    for (; uVar15 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar22 = (ulong)((uVar1 ^ 0xffffffe0) + 0x21);
  if (uVar13 < 2) {
    uVar22 = sVar10 & 0xffffffff;
  }
  iVar21 = (int)uVar22;
  if (1 << ((byte)uVar22 & 0x1f) == uVar13) {
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    piVar11 = (int *)malloc(400);
    p->pArray = piVar11;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        if ((pTruth[uVar14] & 0xfeU) != 0x30) {
          if (p->pArray != (int *)0x0) {
            free(p->pArray);
          }
          free(p);
          printf("String %s does not look like a binary representation of the truth table.\n",pTruth
                );
          return (char *)0x0;
        }
        if (pTruth[uVar14] == 0x31) {
          Vec_IntPush(p,uVar15);
        }
        uVar14 = uVar14 + 1;
        uVar15 = uVar15 - 1;
      } while ((uVar13 & 0x7fffffff) != uVar14);
      uVar1 = p->nSize;
      if (uVar1 != 0 && uVar1 != uVar13) {
        uVar13 = iVar21 + 3;
        pcVar12 = (char *)malloc((long)(int)(uVar1 * uVar13 + 1));
        pcVar12[(int)(uVar1 * uVar13)] = '\0';
        auVar9 = _DAT_007ee2e0;
        piVar11 = p->pArray;
        if (0 < (int)uVar1) {
          lVar18 = uVar22 - 1;
          auVar23._8_4_ = (int)lVar18;
          auVar23._0_8_ = lVar18;
          auVar23._12_4_ = (int)((ulong)lVar18 >> 0x20);
          pcVar17 = pcVar12 + 0xf;
          uVar14 = 0;
          do {
            uVar15 = piVar11[uVar14];
            lVar18 = uVar14 * uVar13;
            uVar20 = 0;
            auVar27 = _DAT_007f4580;
            auVar29 = _DAT_007f4590;
            auVar30 = _DAT_007f45a0;
            auVar31 = _DAT_007f45b0;
            auVar69 = _DAT_007ee2d0;
            auVar70 = _DAT_007ee2c0;
            auVar71 = _DAT_007f45d0;
            auVar72 = _DAT_007f45c0;
            uVar16 = iVar21 - 1;
            do {
              auVar24 = auVar23 ^ auVar9;
              auVar39 = auVar69 ^ auVar9;
              iVar52 = auVar24._0_4_;
              iVar62 = -(uint)(iVar52 < auVar39._0_4_);
              iVar38 = auVar24._4_4_;
              auVar40._4_4_ = -(uint)(iVar38 < auVar39._4_4_);
              iVar61 = auVar24._8_4_;
              iVar66 = -(uint)(iVar61 < auVar39._8_4_);
              iVar26 = auVar24._12_4_;
              auVar40._12_4_ = -(uint)(iVar26 < auVar39._12_4_);
              auVar53._4_4_ = iVar62;
              auVar53._0_4_ = iVar62;
              auVar53._8_4_ = iVar66;
              auVar53._12_4_ = iVar66;
              auVar32 = pshuflw(in_XMM5,auVar53,0xe8);
              auVar42._4_4_ = -(uint)(auVar39._4_4_ == iVar38);
              auVar42._12_4_ = -(uint)(auVar39._12_4_ == iVar26);
              auVar42._0_4_ = auVar42._4_4_;
              auVar42._8_4_ = auVar42._12_4_;
              auVar67 = pshuflw(in_XMM11,auVar42,0xe8);
              auVar40._0_4_ = auVar40._4_4_;
              auVar40._8_4_ = auVar40._12_4_;
              auVar39 = pshuflw(auVar32,auVar40,0xe8);
              auVar24._8_4_ = 0xffffffff;
              auVar24._0_8_ = 0xffffffffffffffff;
              auVar24._12_4_ = 0xffffffff;
              auVar24 = (auVar39 | auVar67 & auVar32) ^ auVar24;
              auVar24 = packssdw(auVar24,auVar24);
              if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pcVar17[uVar20 - 0xf] = (uVar15 >> (uVar16 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar40 = auVar42 & auVar53 | auVar40;
              auVar24 = packssdw(auVar40,auVar40);
              auVar39._8_4_ = 0xffffffff;
              auVar39._0_8_ = 0xffffffffffffffff;
              auVar39._12_4_ = 0xffffffff;
              auVar24 = packssdw(auVar24 ^ auVar39,auVar24 ^ auVar39);
              auVar24 = packsswb(auVar24,auVar24);
              uVar19 = (uint)uVar20;
              if ((auVar24._0_4_ >> 8 & 1) != 0) {
                pcVar17[uVar20 - 0xe] =
                     (uVar15 >> ((uVar19 ^ 0x1e) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar24 = auVar70 ^ auVar9;
              iVar62 = -(uint)(iVar52 < auVar24._0_4_);
              auVar63._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
              iVar66 = -(uint)(iVar61 < auVar24._8_4_);
              auVar63._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
              auVar41._4_4_ = iVar62;
              auVar41._0_4_ = iVar62;
              auVar41._8_4_ = iVar66;
              auVar41._12_4_ = iVar66;
              iVar62 = -(uint)(auVar24._4_4_ == iVar38);
              iVar66 = -(uint)(auVar24._12_4_ == iVar26);
              auVar54._4_4_ = iVar62;
              auVar54._0_4_ = iVar62;
              auVar54._8_4_ = iVar66;
              auVar54._12_4_ = iVar66;
              auVar63._0_4_ = auVar63._4_4_;
              auVar63._8_4_ = auVar63._12_4_;
              auVar24 = auVar54 & auVar41 | auVar63;
              auVar24 = packssdw(auVar24,auVar24);
              auVar2._8_4_ = 0xffffffff;
              auVar2._0_8_ = 0xffffffffffffffff;
              auVar2._12_4_ = 0xffffffff;
              auVar24 = packssdw(auVar24 ^ auVar2,auVar24 ^ auVar2);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24._0_4_ >> 0x10 & 1) != 0) {
                pcVar17[uVar20 - 0xd] =
                     (uVar15 >> ((uVar19 ^ 0x1d) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar24 = pshufhw(auVar24,auVar41,0x84);
              auVar42 = pshufhw(auVar41,auVar54,0x84);
              auVar39 = pshufhw(auVar24,auVar63,0x84);
              auVar33._8_4_ = 0xffffffff;
              auVar33._0_8_ = 0xffffffffffffffff;
              auVar33._12_4_ = 0xffffffff;
              auVar33 = (auVar39 | auVar42 & auVar24) ^ auVar33;
              auVar24 = packssdw(auVar33,auVar33);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24._0_4_ >> 0x18 & 1) != 0) {
                pcVar17[uVar20 - 0xc] =
                     (uVar15 >> ((uVar19 ^ 0x1c) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar24 = auVar71 ^ auVar9;
              iVar62 = -(uint)(iVar52 < auVar24._0_4_);
              auVar44._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
              iVar66 = -(uint)(iVar61 < auVar24._8_4_);
              auVar44._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
              auVar55._4_4_ = iVar62;
              auVar55._0_4_ = iVar62;
              auVar55._8_4_ = iVar66;
              auVar55._12_4_ = iVar66;
              auVar39 = pshuflw(auVar67 & auVar32,auVar55,0xe8);
              auVar67._0_4_ = -(uint)(auVar24._0_4_ == iVar52);
              auVar67._4_4_ = -(uint)(auVar24._4_4_ == iVar38);
              auVar67._8_4_ = -(uint)(auVar24._8_4_ == iVar61);
              auVar67._12_4_ = -(uint)(auVar24._12_4_ == iVar26);
              auVar43._4_4_ = auVar67._4_4_;
              auVar43._0_4_ = auVar67._4_4_;
              auVar43._8_4_ = auVar67._12_4_;
              auVar43._12_4_ = auVar67._12_4_;
              auVar24 = pshuflw(auVar67,auVar43,0xe8);
              auVar44._0_4_ = auVar44._4_4_;
              auVar44._8_4_ = auVar44._12_4_;
              auVar42 = pshuflw(auVar39,auVar44,0xe8);
              auVar32._8_4_ = 0xffffffff;
              auVar32._0_8_ = 0xffffffffffffffff;
              auVar32._12_4_ = 0xffffffff;
              auVar32 = (auVar42 | auVar24 & auVar39) ^ auVar32;
              auVar24 = packssdw(auVar24 & auVar39,auVar32);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pcVar17[uVar20 - 0xb] =
                     (uVar15 >> ((uVar19 ^ 0x1b) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar44 = auVar43 & auVar55 | auVar44;
              auVar39 = packssdw(auVar44,auVar44);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              auVar24 = packssdw(auVar24,auVar39 ^ auVar3);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24._4_2_ >> 8 & 1) != 0) {
                pcVar17[uVar20 - 10] = (uVar15 >> ((uVar19 ^ 0x1a) + iVar21 & 0x1f) & 1) == 0 ^ 0x31
                ;
              }
              auVar24 = auVar72 ^ auVar9;
              iVar62 = -(uint)(iVar52 < auVar24._0_4_);
              auVar64._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
              iVar66 = -(uint)(iVar61 < auVar24._8_4_);
              auVar64._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
              auVar45._4_4_ = iVar62;
              auVar45._0_4_ = iVar62;
              auVar45._8_4_ = iVar66;
              auVar45._12_4_ = iVar66;
              iVar62 = -(uint)(auVar24._4_4_ == iVar38);
              iVar66 = -(uint)(auVar24._12_4_ == iVar26);
              auVar56._4_4_ = iVar62;
              auVar56._0_4_ = iVar62;
              auVar56._8_4_ = iVar66;
              auVar56._12_4_ = iVar66;
              auVar64._0_4_ = auVar64._4_4_;
              auVar64._8_4_ = auVar64._12_4_;
              auVar24 = auVar56 & auVar45 | auVar64;
              auVar24 = packssdw(auVar24,auVar24);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              auVar24 = packssdw(auVar24 ^ auVar4,auVar24 ^ auVar4);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pcVar17[uVar20 - 9] = (uVar15 >> ((uVar19 ^ 0x19) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar24 = pshufhw(auVar24,auVar45,0x84);
              auVar42 = pshufhw(auVar45,auVar56,0x84);
              auVar39 = pshufhw(auVar24,auVar64,0x84);
              auVar34._8_4_ = 0xffffffff;
              auVar34._0_8_ = 0xffffffffffffffff;
              auVar34._12_4_ = 0xffffffff;
              auVar34 = (auVar39 | auVar42 & auVar24) ^ auVar34;
              auVar24 = packssdw(auVar34,auVar34);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24._6_2_ >> 8 & 1) != 0) {
                pcVar17[uVar20 - 8] = (uVar15 >> ((uVar19 ^ 0x18) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar24 = auVar31 ^ auVar9;
              iVar62 = -(uint)(iVar52 < auVar24._0_4_);
              auVar47._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
              iVar66 = -(uint)(iVar61 < auVar24._8_4_);
              auVar47._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
              auVar57._4_4_ = iVar62;
              auVar57._0_4_ = iVar62;
              auVar57._8_4_ = iVar66;
              auVar57._12_4_ = iVar66;
              auVar32 = pshuflw(auVar32,auVar57,0xe8);
              auVar35._0_4_ = -(uint)(auVar24._0_4_ == iVar52);
              auVar35._4_4_ = -(uint)(auVar24._4_4_ == iVar38);
              auVar35._8_4_ = -(uint)(auVar24._8_4_ == iVar61);
              auVar35._12_4_ = -(uint)(auVar24._12_4_ == iVar26);
              auVar46._4_4_ = auVar35._4_4_;
              auVar46._0_4_ = auVar35._4_4_;
              auVar46._8_4_ = auVar35._12_4_;
              auVar46._12_4_ = auVar35._12_4_;
              auVar24 = pshuflw(auVar35,auVar46,0xe8);
              auVar47._0_4_ = auVar47._4_4_;
              auVar47._8_4_ = auVar47._12_4_;
              auVar39 = pshuflw(auVar32,auVar47,0xe8);
              auVar68._8_4_ = 0xffffffff;
              auVar68._0_8_ = 0xffffffffffffffff;
              auVar68._12_4_ = 0xffffffff;
              auVar68 = (auVar39 | auVar24 & auVar32) ^ auVar68;
              auVar39 = packssdw(auVar68,auVar68);
              auVar24 = packsswb(auVar24 & auVar32,auVar39);
              if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pcVar17[uVar20 - 7] = (uVar15 >> ((uVar19 ^ 0x17) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar47 = auVar46 & auVar57 | auVar47;
              auVar32 = packssdw(auVar47,auVar47);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar32 = packssdw(auVar32 ^ auVar5,auVar32 ^ auVar5);
              auVar24 = packsswb(auVar24,auVar32);
              if ((auVar24._8_2_ >> 8 & 1) != 0) {
                pcVar17[uVar20 - 6] = (uVar15 >> ((uVar19 ^ 0x16) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar24 = auVar30 ^ auVar9;
              iVar62 = -(uint)(iVar52 < auVar24._0_4_);
              auVar65._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
              iVar66 = -(uint)(iVar61 < auVar24._8_4_);
              auVar65._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
              auVar48._4_4_ = iVar62;
              auVar48._0_4_ = iVar62;
              auVar48._8_4_ = iVar66;
              auVar48._12_4_ = iVar66;
              iVar62 = -(uint)(auVar24._4_4_ == iVar38);
              iVar66 = -(uint)(auVar24._12_4_ == iVar26);
              auVar58._4_4_ = iVar62;
              auVar58._0_4_ = iVar62;
              auVar58._8_4_ = iVar66;
              auVar58._12_4_ = iVar66;
              auVar65._0_4_ = auVar65._4_4_;
              auVar65._8_4_ = auVar65._12_4_;
              auVar24 = auVar58 & auVar48 | auVar65;
              auVar24 = packssdw(auVar24,auVar24);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar24 = packssdw(auVar24 ^ auVar6,auVar24 ^ auVar6);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                pcVar17[uVar20 - 5] = (uVar15 >> ((uVar19 ^ 0x15) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar24 = pshufhw(auVar24,auVar48,0x84);
              auVar42 = pshufhw(auVar48,auVar58,0x84);
              auVar32 = pshufhw(auVar24,auVar65,0x84);
              auVar36._8_4_ = 0xffffffff;
              auVar36._0_8_ = 0xffffffffffffffff;
              auVar36._12_4_ = 0xffffffff;
              auVar36 = (auVar32 | auVar42 & auVar24) ^ auVar36;
              auVar24 = packssdw(auVar36,auVar36);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24._10_2_ >> 8 & 1) != 0) {
                pcVar17[uVar20 - 4] = (uVar15 >> ((uVar19 ^ 0x14) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar24 = auVar29 ^ auVar9;
              iVar62 = -(uint)(iVar52 < auVar24._0_4_);
              auVar50._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
              iVar66 = -(uint)(iVar61 < auVar24._8_4_);
              auVar50._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
              auVar59._4_4_ = iVar62;
              auVar59._0_4_ = iVar62;
              auVar59._8_4_ = iVar66;
              auVar59._12_4_ = iVar66;
              auVar32 = pshuflw(auVar39,auVar59,0xe8);
              auVar37._0_4_ = -(uint)(auVar24._0_4_ == iVar52);
              auVar37._4_4_ = -(uint)(auVar24._4_4_ == iVar38);
              auVar37._8_4_ = -(uint)(auVar24._8_4_ == iVar61);
              auVar37._12_4_ = -(uint)(auVar24._12_4_ == iVar26);
              auVar49._4_4_ = auVar37._4_4_;
              auVar49._0_4_ = auVar37._4_4_;
              auVar49._8_4_ = auVar37._12_4_;
              auVar49._12_4_ = auVar37._12_4_;
              auVar24 = pshuflw(auVar37,auVar49,0xe8);
              auVar50._0_4_ = auVar50._4_4_;
              auVar50._8_4_ = auVar50._12_4_;
              auVar39 = pshuflw(auVar32,auVar50,0xe8);
              in_XMM11._8_4_ = 0xffffffff;
              in_XMM11._0_8_ = 0xffffffffffffffff;
              in_XMM11._12_4_ = 0xffffffff;
              in_XMM11 = (auVar39 | auVar24 & auVar32) ^ in_XMM11;
              auVar24 = packssdw(auVar24 & auVar32,in_XMM11);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pcVar17[uVar20 - 3] = (uVar15 >> ((uVar19 ^ 0x13) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar50 = auVar49 & auVar59 | auVar50;
              auVar32 = packssdw(auVar50,auVar50);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar24 = packssdw(auVar24,auVar32 ^ auVar7);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24._12_2_ >> 8 & 1) != 0) {
                pcVar17[uVar20 - 2] = (uVar15 >> ((uVar19 ^ 0x12) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar24 = auVar27 ^ auVar9;
              iVar52 = -(uint)(iVar52 < auVar24._0_4_);
              auVar60._4_4_ = -(uint)(iVar38 < auVar24._4_4_);
              iVar61 = -(uint)(iVar61 < auVar24._8_4_);
              auVar60._12_4_ = -(uint)(iVar26 < auVar24._12_4_);
              auVar51._4_4_ = iVar52;
              auVar51._0_4_ = iVar52;
              auVar51._8_4_ = iVar61;
              auVar51._12_4_ = iVar61;
              iVar52 = -(uint)(auVar24._4_4_ == iVar38);
              iVar38 = -(uint)(auVar24._12_4_ == iVar26);
              auVar25._4_4_ = iVar52;
              auVar25._0_4_ = iVar52;
              auVar25._8_4_ = iVar38;
              auVar25._12_4_ = iVar38;
              auVar60._0_4_ = auVar60._4_4_;
              auVar60._8_4_ = auVar60._12_4_;
              auVar24 = auVar25 & auVar51 | auVar60;
              auVar24 = packssdw(auVar24,auVar24);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar24 = packssdw(auVar24 ^ auVar8,auVar24 ^ auVar8);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pcVar17[uVar20 - 1] = (uVar15 >> ((uVar19 ^ 0x11) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              auVar32 = pshufhw(auVar24,auVar51,0x84);
              auVar24 = pshufhw(auVar25,auVar25,0x84);
              auVar39 = pshufhw(auVar32,auVar60,0x84);
              in_XMM5._8_4_ = 0xffffffff;
              in_XMM5._0_8_ = 0xffffffffffffffff;
              in_XMM5._12_4_ = 0xffffffff;
              in_XMM5 = (auVar39 | auVar24 & auVar32) ^ in_XMM5;
              auVar24 = packssdw(auVar24 & auVar32,in_XMM5);
              auVar24 = packsswb(auVar24,auVar24);
              if ((auVar24._14_2_ >> 8 & 1) != 0) {
                pcVar17[uVar20] = (uVar15 >> ((uVar19 ^ 0x10) + iVar21 & 0x1f) & 1) == 0 ^ 0x31;
              }
              uVar20 = uVar20 + 0x10;
              lVar28 = auVar69._8_8_;
              auVar69._0_8_ = auVar69._0_8_ + 0x10;
              auVar69._8_8_ = lVar28 + 0x10;
              lVar28 = auVar70._8_8_;
              auVar70._0_8_ = auVar70._0_8_ + 0x10;
              auVar70._8_8_ = lVar28 + 0x10;
              lVar28 = auVar71._8_8_;
              auVar71._0_8_ = auVar71._0_8_ + 0x10;
              auVar71._8_8_ = lVar28 + 0x10;
              lVar28 = auVar72._8_8_;
              auVar72._0_8_ = auVar72._0_8_ + 0x10;
              auVar72._8_8_ = lVar28 + 0x10;
              lVar28 = auVar31._8_8_;
              auVar31._0_8_ = auVar31._0_8_ + 0x10;
              auVar31._8_8_ = lVar28 + 0x10;
              lVar28 = auVar30._8_8_;
              auVar30._0_8_ = auVar30._0_8_ + 0x10;
              auVar30._8_8_ = lVar28 + 0x10;
              lVar28 = auVar29._8_8_;
              auVar29._0_8_ = auVar29._0_8_ + 0x10;
              auVar29._8_8_ = lVar28 + 0x10;
              lVar28 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 0x10;
              auVar27._8_8_ = lVar28 + 0x10;
              uVar16 = uVar16 - 0x10;
            } while ((iVar21 + 0xfU & 0xfffffff0) != uVar20);
            (pcVar12 + uVar22 + lVar18)[0] = ' ';
            (pcVar12 + uVar22 + lVar18)[1] = '1';
            pcVar12[uVar22 + lVar18 + 2] = '\n';
            uVar14 = uVar14 + 1;
            pcVar17 = pcVar17 + uVar13;
          } while (uVar14 != uVar1);
        }
        if (piVar11 != (int *)0x0) {
          free(piVar11);
        }
        free(p);
        return pcVar12;
      }
      piVar11 = p->pArray;
    }
    if (piVar11 != (int *)0x0) {
      free(piVar11);
    }
    free(p);
    puts("Cannot create constant function.");
  }
  else {
    printf("String %s does not look like a truth table of a %d-variable function.\n",pTruth,uVar22);
  }
  return (char *)0x0;
}

Assistant:

char * Abc_SopFromTruthBin( char * pTruth )
{
    char * pSopCover, * pCube;
    int nTruthSize, nVars, Digit, Length, Mint, i, b;
    Vec_Int_t * vMints;

    // get the number of variables
    nTruthSize = strlen(pTruth);
    nVars = Abc_Base2Log( nTruthSize );
    if ( nTruthSize != (1 << (nVars)) )
    {
        printf( "String %s does not look like a truth table of a %d-variable function.\n", pTruth, nVars );
        return NULL;
    }

    // collect the on-set minterms
    vMints = Vec_IntAlloc( 100 );
    for ( i = 0; i < nTruthSize; i++ )
    {
        if ( pTruth[i] >= '0' && pTruth[i] <= '1' )
            Digit = pTruth[i] - '0';
        else
        {
            Vec_IntFree( vMints );
            printf( "String %s does not look like a binary representation of the truth table.\n", pTruth );
            return NULL;
        }
        if ( Digit == 1 )
            Vec_IntPush( vMints, nTruthSize - 1 - i );
    }
    if ( Vec_IntSize( vMints ) == 0 || Vec_IntSize( vMints ) == nTruthSize )
    {
        Vec_IntFree( vMints );
        printf( "Cannot create constant function.\n" );
        return NULL;
    }

    // create the SOP representation of the minterms
    Length = Vec_IntSize(vMints) * (nVars + 3);
    pSopCover = ABC_ALLOC( char, Length + 1 );
    pSopCover[Length] = 0;
    Vec_IntForEachEntry( vMints, Mint, i )
    {
        pCube = pSopCover + i * (nVars + 3);
        for ( b = 0; b < nVars; b++ )
            if ( Mint & (1 << (nVars-1-b)) )
//            if ( Mint & (1 << b) )
                pCube[b] = '1';
            else
                pCube[b] = '0';
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
    Vec_IntFree( vMints );
    return pSopCover;
}